

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

void __thiscall
pbrt::KdTreeAggregate::buildTree
          (KdTreeAggregate *this,int nodeNum,Bounds3f *nodeBounds,
          vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *allPrimBounds,
          int *primNums,int nPrimitives,int depth,
          unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *edges,int *prims0,
          int *prims1,int badRefines)

{
  float fVar1;
  Float s;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int *piVar4;
  ulong uVar5;
  type pBVar6;
  type pBVar7;
  float *pfVar8;
  Bounds3f *in_RCX;
  int iVar9;
  int i_00;
  Tuple3<pbrt::Point3,_float> *in_RDX;
  int in_ESI;
  int *in_RDI;
  vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *in_R8;
  int in_R9D;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [56];
  undefined1 auVar15 [64];
  Vector3<float> VVar17;
  int unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  int in_stack_00000028;
  int aboveChild;
  Bounds3f bounds1;
  Bounds3f bounds0;
  Float tSplit;
  int i_3;
  int i_2;
  int n1;
  int n0;
  Float cost;
  Float eb;
  Float pAbove;
  Float pBelow;
  Float aboveSA;
  Float belowSA;
  int otherAxis1;
  int otherAxis0;
  Float edgeT;
  int i_1;
  int nAbove;
  int nBelow;
  Bounds3f *bounds;
  int pn;
  int i;
  int retries;
  int axis;
  Vector3f d;
  Float invTotalSA;
  Float totalSA;
  Float oldCost;
  Float bestCost;
  int bestOffset;
  int bestAxis;
  KdAccelNode *n;
  int nNewAllocNodes;
  int vb;
  int va;
  size_t in_stack_fffffffffffffe48;
  unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *in_stack_fffffffffffffe50;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe58;
  Bounds3<float> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  Float FVar18;
  float local_188;
  float in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe94;
  float in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  char *in_stack_fffffffffffffea8;
  void *in_stack_fffffffffffffeb0;
  LogLevel in_stack_fffffffffffffec4;
  undefined8 local_138;
  char (*in_stack_fffffffffffffed0) [8];
  int *in_stack_fffffffffffffed8;
  char (*in_stack_fffffffffffffee0) [13];
  int *in_stack_fffffffffffffee8;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_d0;
  int local_cc;
  int local_c8;
  BoundEdge local_c0;
  BoundEdge local_b4;
  const_reference local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  Tuple3<pbrt::Vector3,_float> local_90;
  Tuple3<pbrt::Vector3,_float> local_7c;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  int local_60;
  int local_5c;
  void *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int nPrimitives_00;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar19;
  
  nPrimitives_00 = in_RDI[0x13];
  if (in_ESI != nPrimitives_00) {
    LogFatal<char_const(&)[8],char_const(&)[13],char_const(&)[8],int&,char_const(&)[13],int&>
              (in_stack_fffffffffffffec4,(char *)in_RDI,
               (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),in_stack_fffffffffffffea8,
               (char (*) [8])CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (char (*) [13])CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffee8);
  }
  iVar19 = in_ESI;
  if (in_RDI[0x13] == in_RDI[0x12]) {
    local_4c = in_RDI[0x12] << 1;
    local_50 = 0x200;
    piVar4 = std::max<int>(&local_4c,&local_50);
    local_48 = *piVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)local_48;
    uVar5 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    local_58 = operator_new__(uVar5);
    if (0 < in_RDI[0x12]) {
      memcpy(local_58,*(void **)(in_RDI + 0x10),(long)in_RDI[0x12] << 3);
      in_stack_fffffffffffffeb0 = *(void **)(in_RDI + 0x10);
      if (in_stack_fffffffffffffeb0 != (void *)0x0) {
        operator_delete__(in_stack_fffffffffffffeb0);
      }
    }
    *(void **)(in_RDI + 0x10) = local_58;
    in_RDI[0x12] = local_48;
  }
  in_RDI[0x13] = in_RDI[0x13] + 1;
  if ((in_RDI[2] < in_R9D) && (in_stack_00000008 != 0)) {
    local_5c = -1;
    local_60 = -1;
    local_64 = INFINITY;
    local_68 = (float)*in_RDI * (float)in_R9D;
    local_6c = Bounds3<float>::SurfaceArea(in_stack_fffffffffffffe60);
    local_70 = 1.0 / local_6c;
    auVar16 = ZEXT856(0);
    VVar17 = Point3<float>::operator-
                       (&in_stack_fffffffffffffe60->pMin,(Point3<float> *)in_stack_fffffffffffffe58)
    ;
    local_90.z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar15._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar15._8_56_ = auVar16;
    local_90._0_8_ = vmovlpd_avx(auVar15._0_16_);
    local_7c._0_8_ = local_90._0_8_;
    local_7c.z = local_90.z;
    local_94 = Bounds3<float>::MaxDimension
                         ((Bounds3<float> *)
                          CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_98 = 0;
    while( true ) {
      local_cc = in_R9D;
      for (local_9c = 0; local_9c < local_cc; local_9c = local_9c + 1) {
        local_a0 = *(int *)((long)&(in_R8->
                                   super__Vector_base<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + (long)local_9c * 4);
        local_a8 = std::vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>::
                   operator[]((vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>
                               *)in_RCX,(long)local_a0);
        fVar10 = Tuple3<pbrt::Point3,_float>::operator[]
                           ((Tuple3<pbrt::Point3,_float> *)local_a8,local_94);
        BoundEdge::BoundEdge(&local_b4,fVar10,local_a0,true);
        pBVar6 = std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::
                 operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        pBVar6->t = local_b4.t;
        pBVar6->primNum = local_b4.primNum;
        pBVar6->type = local_b4.type;
        fVar10 = Tuple3<pbrt::Point3,_float>::operator[]
                           (&(local_a8->pMax).super_Tuple3<pbrt::Point3,_float>,local_94);
        BoundEdge::BoundEdge(&local_c0,fVar10,local_a0,false);
        pBVar6 = std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::
                 operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        pBVar6->t = local_c0.t;
        pBVar6->primNum = local_c0.primNum;
        pBVar6->type = local_c0.type;
      }
      pBVar6 = std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::
               operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      pBVar7 = std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::
               operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      std::
      sort<pbrt::BoundEdge*,pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,int*,int,int,std::unique_ptr<pbrt::BoundEdge[],std::default_delete<pbrt::BoundEdge[]>>const*,int*,int*,int)::__0>
                (pBVar6,pBVar7);
      local_c8 = 0;
      in_R9D = local_cc;
      for (local_d0 = 0; SBORROW4(local_d0,in_R9D * 2) != local_d0 + in_R9D * -2 < 0;
          local_d0 = local_d0 + 1) {
        pBVar7 = std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::
                 operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        if (pBVar7->type == End) {
          local_cc = local_cc + -1;
        }
        pBVar7 = std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::
                 operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        fVar10 = pBVar7->t;
        in_stack_fffffffffffffea4 = fVar10;
        fVar11 = Tuple3<pbrt::Point3,_float>::operator[](in_RDX,local_94);
        if ((fVar11 < in_stack_fffffffffffffea4) &&
           (fVar11 = fVar10, fVar12 = Tuple3<pbrt::Point3,_float>::operator[](in_RDX + 1,local_94),
           fVar11 < fVar12)) {
          iVar9 = (local_94 + 1) % 3;
          i_00 = (local_94 + 2) % 3;
          pfVar8 = Tuple3<pbrt::Vector3,_float>::operator[](&local_7c,iVar9);
          fVar11 = *pfVar8;
          pfVar8 = Tuple3<pbrt::Vector3,_float>::operator[](&local_7c,i_00);
          fVar12 = *pfVar8;
          fVar13 = Tuple3<pbrt::Point3,_float>::operator[](in_RDX,local_94);
          pfVar8 = Tuple3<pbrt::Vector3,_float>::operator[](&local_7c,iVar9);
          fVar1 = *pfVar8;
          pfVar8 = Tuple3<pbrt::Vector3,_float>::operator[](&local_7c,i_00);
          auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar12),ZEXT416((uint)fVar11),
                                   ZEXT416((uint)((fVar10 - fVar13) * (fVar1 + *pfVar8))));
          pfVar8 = Tuple3<pbrt::Vector3,_float>::operator[](&local_7c,iVar9);
          in_stack_fffffffffffffe9c = *pfVar8;
          pfVar8 = Tuple3<pbrt::Vector3,_float>::operator[](&local_7c,i_00);
          in_stack_fffffffffffffe98 = *pfVar8;
          in_stack_fffffffffffffe94 = Tuple3<pbrt::Point3,_float>::operator[](in_RDX + 1,local_94);
          in_stack_fffffffffffffe94 = in_stack_fffffffffffffe94 - fVar10;
          pfVar8 = Tuple3<pbrt::Vector3,_float>::operator[](&local_7c,iVar9);
          in_stack_fffffffffffffe90 = *pfVar8;
          pfVar8 = Tuple3<pbrt::Vector3,_float>::operator[](&local_7c,i_00);
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)in_stack_fffffffffffffe98),
                                   ZEXT416((uint)in_stack_fffffffffffffe9c),
                                   ZEXT416((uint)(in_stack_fffffffffffffe94 *
                                                 (in_stack_fffffffffffffe90 + *pfVar8))));
          if ((local_cc == 0) || (local_c8 == 0)) {
            local_188 = (float)in_RDI[3];
          }
          else {
            local_188 = 0.0;
          }
          auVar14._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar14._0_4_ = (float)local_c8;
          auVar2 = vfmadd213ss_fma(auVar14,ZEXT416((uint)(auVar2._0_4_ * 2.0 * local_70)),
                                   ZEXT416((uint)(auVar3._0_4_ * 2.0 * local_70 * (float)local_cc)))
          ;
          auVar2 = vfmadd213ss_fma(auVar2,ZEXT416((uint)((float)*in_RDI * (1.0 - local_188))),
                                   ZEXT416((uint)(float)in_RDI[1]));
          if (auVar2._0_4_ < local_64) {
            local_5c = local_94;
            local_60 = local_d0;
            local_64 = auVar2._0_4_;
          }
        }
        pBVar7 = std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::
                 operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        if (pBVar7->type == Start) {
          local_c8 = local_c8 + 1;
        }
      }
      if ((local_c8 != in_R9D) || (local_cc != 0)) {
        LogFatal<char_const(&)[37]>
                  ((LogLevel)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(char *)pBVar6,
                   (int)in_stack_fffffffffffffea4,
                   (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   (char (*) [37])CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      }
      if ((local_5c != -1) || (1 < local_98)) break;
      local_98 = local_98 + 1;
      local_94 = (local_94 + 1) % 3;
    }
    if (local_68 < local_64) {
      in_stack_00000028 = in_stack_00000028 + 1;
    }
    if ((((local_68 * 4.0 < local_64) && (in_R9D < 0x10)) || (local_5c == -1)) ||
       (in_stack_00000028 == 3)) {
      KdAccelNode::InitLeaf
                ((KdAccelNode *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),in_stack_fffffffffffffe58);
    }
    else {
      local_f8 = 0;
      local_fc = 0;
      for (local_100 = 0; local_104 = local_60, local_100 < local_60; local_100 = local_100 + 1) {
        pBVar6 = std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::
                 operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        if (pBVar6->type == Start) {
          pBVar6 = std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::
                   operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          in_stack_00000018[local_f8] = pBVar6->primNum;
          local_f8 = local_f8 + 1;
        }
      }
      while (local_104 = local_104 + 1,
            SBORROW4(local_104,in_R9D * 2) != local_104 + in_R9D * -2 < 0) {
        pBVar6 = std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::
                 operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        if (pBVar6->type == End) {
          pBVar6 = std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::
                   operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          *(int *)(CONCAT44(in_stack_00000024,in_stack_00000020) + (long)local_fc * 4) =
               pBVar6->primNum;
          local_fc = local_fc + 1;
        }
      }
      pBVar6 = std::unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_>::
               operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      s = pBVar6->t;
      local_138._0_4_ = in_RDX->x;
      local_138._4_4_ = in_RDX->y;
      FVar18 = s;
      pfVar8 = Tuple3<pbrt::Point3,_float>::operator[]
                         ((Tuple3<pbrt::Point3,_float> *)&local_138,local_5c);
      iVar9 = (int)((ulong)in_RDX >> 0x20);
      *pfVar8 = FVar18;
      pfVar8 = Tuple3<pbrt::Point3,_float>::operator[]
                         ((Tuple3<pbrt::Point3,_float> *)&stack0xfffffffffffffeec,local_5c);
      *pfVar8 = FVar18;
      buildTree((KdTreeAggregate *)CONCAT44(iVar19,in_stack_ffffffffffffffe0),iVar9,in_RCX,in_R8,
                (int *)CONCAT44(in_R9D,in_ESI),nPrimitives_00,unaff_retaddr,
                (unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *)
                CONCAT44(in_stack_0000000c,in_stack_00000008),in_stack_00000010,in_stack_00000018,
                in_stack_00000020);
      KdAccelNode::InitInterior
                ((KdAccelNode *)(*(long *)(in_RDI + 0x10) + (long)iVar19 * 8),local_5c,in_RDI[0x13],
                 s);
      buildTree((KdTreeAggregate *)CONCAT44(iVar19,in_stack_ffffffffffffffe0),iVar9,in_RCX,in_R8,
                (int *)CONCAT44(in_R9D,in_ESI),nPrimitives_00,unaff_retaddr,
                (unique_ptr<pbrt::BoundEdge[],_std::default_delete<pbrt::BoundEdge[]>_> *)
                CONCAT44(in_stack_0000000c,in_stack_00000008),in_stack_00000010,in_stack_00000018,
                in_stack_00000020);
    }
  }
  else {
    KdAccelNode::InitLeaf
              ((KdAccelNode *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),in_stack_fffffffffffffe58);
  }
  return;
}

Assistant:

void KdTreeAggregate::buildTree(int nodeNum, const Bounds3f &nodeBounds,
                                const std::vector<Bounds3f> &allPrimBounds, int *primNums,
                                int nPrimitives, int depth,
                                const std::unique_ptr<BoundEdge[]> edges[3], int *prims0,
                                int *prims1, int badRefines) {
    CHECK_EQ(nodeNum, nextFreeNode);
    // Get next free node from _nodes_ array
    if (nextFreeNode == nAllocedNodes) {
        int nNewAllocNodes = std::max(2 * nAllocedNodes, 512);
        KdAccelNode *n = new KdAccelNode[nNewAllocNodes];
        if (nAllocedNodes > 0) {
            memcpy(n, nodes, nAllocedNodes * sizeof(KdAccelNode));
            delete[] nodes;
        }
        nodes = n;
        nAllocedNodes = nNewAllocNodes;
    }
    ++nextFreeNode;

    // Initialize leaf node if termination criteria met
    if (nPrimitives <= maxPrims || depth == 0) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Initialize interior node and continue recursion
    // Choose split axis position for interior node
    int bestAxis = -1, bestOffset = -1;
    Float bestCost = Infinity;
    Float oldCost = isectCost * Float(nPrimitives);
    Float totalSA = nodeBounds.SurfaceArea();
    Float invTotalSA = 1 / totalSA;
    Vector3f d = nodeBounds.pMax - nodeBounds.pMin;
    // Choose which axis to split along
    int axis = nodeBounds.MaxDimension();

    int retries = 0;
retrySplit:
    // Initialize edges for _axis_
    for (int i = 0; i < nPrimitives; ++i) {
        int pn = primNums[i];
        const Bounds3f &bounds = allPrimBounds[pn];
        edges[axis][2 * i] = BoundEdge(bounds.pMin[axis], pn, true);
        edges[axis][2 * i + 1] = BoundEdge(bounds.pMax[axis], pn, false);
    }
    // Sort _edges_ for _axis_
    std::sort(&edges[axis][0], &edges[axis][2 * nPrimitives],
              [](const BoundEdge &e0, const BoundEdge &e1) -> bool {
                  if (e0.t == e1.t)
                      return (int)e0.type < (int)e1.type;
                  else
                      return e0.t < e1.t;
              });

    // Compute cost of all splits for _axis_ to find best
    int nBelow = 0, nAbove = nPrimitives;
    for (int i = 0; i < 2 * nPrimitives; ++i) {
        if (edges[axis][i].type == EdgeType::End)
            --nAbove;
        Float edgeT = edges[axis][i].t;
        if (edgeT > nodeBounds.pMin[axis] && edgeT < nodeBounds.pMax[axis]) {
            // Compute cost for split at _i_th edge
            // Compute child surface areas for split at _edgeT_
            int otherAxis0 = (axis + 1) % 3, otherAxis1 = (axis + 2) % 3;
            Float belowSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (edgeT - nodeBounds.pMin[axis]) * (d[otherAxis0] + d[otherAxis1]));
            Float aboveSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (nodeBounds.pMax[axis] - edgeT) * (d[otherAxis0] + d[otherAxis1]));

            Float pBelow = belowSA * invTotalSA;
            Float pAbove = aboveSA * invTotalSA;
            Float eb = (nAbove == 0 || nBelow == 0) ? emptyBonus : 0;
            Float cost = traversalCost +
                         isectCost * (1 - eb) * (pBelow * nBelow + pAbove * nAbove);
            // Update best split if this is lowest cost so far
            if (cost < bestCost) {
                bestCost = cost;
                bestAxis = axis;
                bestOffset = i;
            }
        }
        if (edges[axis][i].type == EdgeType::Start)
            ++nBelow;
    }
    CHECK(nBelow == nPrimitives && nAbove == 0);

    // Create leaf if no good splits were found
    if (bestAxis == -1 && retries < 2) {
        ++retries;
        axis = (axis + 1) % 3;
        goto retrySplit;
    }
    if (bestCost > oldCost)
        ++badRefines;
    if ((bestCost > 4 * oldCost && nPrimitives < 16) || bestAxis == -1 ||
        badRefines == 3) {
        nodes[nodeNum].InitLeaf(primNums, nPrimitives, &primitiveIndices);
        return;
    }

    // Classify primitives with respect to split
    int n0 = 0, n1 = 0;
    for (int i = 0; i < bestOffset; ++i)
        if (edges[bestAxis][i].type == EdgeType::Start)
            prims0[n0++] = edges[bestAxis][i].primNum;
    for (int i = bestOffset + 1; i < 2 * nPrimitives; ++i)
        if (edges[bestAxis][i].type == EdgeType::End)
            prims1[n1++] = edges[bestAxis][i].primNum;

    // Recursively initialize children nodes
    Float tSplit = edges[bestAxis][bestOffset].t;
    Bounds3f bounds0 = nodeBounds, bounds1 = nodeBounds;
    bounds0.pMax[bestAxis] = bounds1.pMin[bestAxis] = tSplit;
    buildTree(nodeNum + 1, bounds0, allPrimBounds, prims0, n0, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
    int aboveChild = nextFreeNode;
    nodes[nodeNum].InitInterior(bestAxis, aboveChild, tSplit);
    buildTree(aboveChild, bounds1, allPrimBounds, prims1, n1, depth - 1, edges, prims0,
              prims1 + nPrimitives, badRefines);
}